

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

void tcase_add_fixture(TCase *tc,SFun setup,SFun teardown,int ischecked)

{
  List *pLVar1;
  undefined4 *puVar2;
  long lVar3;
  undefined4 uVar4;
  
  if (setup == (SFun)0x0) {
LAB_001530db:
    if (teardown == (SFun)0x0) {
      return;
    }
    if (ischecked != 0) {
      uVar4 = 1;
      lVar3 = 0x38;
      goto LAB_0015311f;
    }
  }
  else {
    if (ischecked != 0) {
      pLVar1 = tc->ch_sflst;
      puVar2 = (undefined4 *)emalloc(0x10);
      *(SFun *)(puVar2 + 2) = setup;
      *puVar2 = 1;
      check_list_add_end(pLVar1,puVar2);
      goto LAB_001530db;
    }
    pLVar1 = tc->unch_sflst;
    puVar2 = (undefined4 *)emalloc(0x10);
    *(SFun *)(puVar2 + 2) = setup;
    *puVar2 = 0;
    check_list_add_end(pLVar1,puVar2);
    if (teardown == (SFun)0x0) {
      return;
    }
  }
  uVar4 = 0;
  lVar3 = 0x28;
LAB_0015311f:
  pLVar1 = *(List **)((long)&tc->name + lVar3);
  puVar2 = (undefined4 *)emalloc(0x10);
  *(SFun *)(puVar2 + 2) = teardown;
  *puVar2 = uVar4;
  check_list_add_front(pLVar1,puVar2);
  return;
}

Assistant:

static void tcase_add_fixture(TCase * tc, SFun setup, SFun teardown,
                              int ischecked)
{
    if(setup)
    {
        if(ischecked)
            check_list_add_end(tc->ch_sflst,
                               fixture_create(setup, ischecked));
        else
            check_list_add_end(tc->unch_sflst,
                               fixture_create(setup, ischecked));
    }

    /* Add teardowns at front so they are run in reverse order. */
    if(teardown)
    {
        if(ischecked)
            check_list_add_front(tc->ch_tflst,
                                 fixture_create(teardown, ischecked));
        else
            check_list_add_front(tc->unch_tflst,
                                 fixture_create(teardown, ischecked));
    }
}